

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
          (QSharedDataPointer<QStyleSheetPaletteData> *this)

{
  QStyleSheetPaletteData *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QStyleSheetPaletteData *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int> == 0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QStyleSheetPaletteData *)0x0)) {
      QBrush::~QBrush(&pQVar1->accent);
      QBrush::~QBrush(&pQVar1->placeholderForeground);
      QBrush::~QBrush(&pQVar1->alternateBackground);
      QBrush::~QBrush(&pQVar1->selectionBackground);
      QBrush::~QBrush(&pQVar1->selectionForeground);
      QBrush::~QBrush(&pQVar1->foreground);
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }